

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildHandler::LaunchHelper::LaunchHelper(LaunchHelper *this,cmCTestBuildHandler *handler)

{
  ulong uVar1;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  undefined1 local_120 [8];
  string launchEnv;
  cmAlphaNum local_f0;
  string local_b0;
  cmAlphaNum local_90;
  string local_60;
  string *local_40;
  string *launchDir;
  string tag;
  cmCTestBuildHandler *handler_local;
  LaunchHelper *this_local;
  
  this->Handler = handler;
  this->CTest = (handler->super_cmCTestGenericHandler).CTest;
  tag.field_2._8_8_ = handler;
  cmCTest::GetCurrentTag_abi_cxx11_((string *)&launchDir,this->CTest);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_40 = &this->Handler->CTestLaunchDir;
    cmCTest::GetBinaryDir_abi_cxx11_(&local_b0,this->CTest);
    cmAlphaNum::cmAlphaNum(&local_90,&local_b0);
    cmAlphaNum::cmAlphaNum(&local_f0,"/Testing/");
    cmStrCat<std::__cxx11::string,char[7]>
              (&local_60,&local_90,&local_f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&launchDir,
               (char (*) [7])"/Build");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_b0);
    cmsys::SystemTools::RemoveADirectory(local_40);
    if ((this->Handler->UseCTestLaunch & 1U) != 0) {
      launchEnv.field_2._8_8_ = cmsys::SystemTools::MakeDirectory(local_40,(mode_t *)0x0);
      WriteLauncherConfig(this);
      cmAlphaNum::cmAlphaNum(&local_150,"CTEST_LAUNCH_LOGS=");
      cmAlphaNum::cmAlphaNum(&local_180,local_40);
      cmStrCat<>((string *)local_120,&local_150,&local_180);
      cmsys::SystemTools::PutEnv((string *)local_120);
      std::__cxx11::string::~string((string *)local_120);
    }
  }
  else {
    this->Handler->UseCTestLaunch = false;
  }
  if ((this->Handler->UseCTestLaunch & 1U) == 0) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
  std::__cxx11::string::~string((string *)&launchDir);
  return;
}

Assistant:

cmCTestBuildHandler::LaunchHelper::LaunchHelper(cmCTestBuildHandler* handler)
  : Handler(handler)
  , CTest(handler->CTest)
{
  std::string tag = this->CTest->GetCurrentTag();
  if (tag.empty()) {
    // This is not for a dashboard submission, so there is no XML.
    // Skip enabling the launchers.
    this->Handler->UseCTestLaunch = false;
  } else {
    // Compute a directory in which to store launcher fragments.
    std::string& launchDir = this->Handler->CTestLaunchDir;
    launchDir =
      cmStrCat(this->CTest->GetBinaryDir(), "/Testing/", tag, "/Build");

    // Clean out any existing launcher fragments.
    cmSystemTools::RemoveADirectory(launchDir);

    if (this->Handler->UseCTestLaunch) {
      // Enable launcher fragments.
      cmSystemTools::MakeDirectory(launchDir);
      this->WriteLauncherConfig();
      std::string launchEnv = cmStrCat("CTEST_LAUNCH_LOGS=", launchDir);
      cmSystemTools::PutEnv(launchEnv);
    }
  }

  // If not using launchers, make sure they passthru.
  if (!this->Handler->UseCTestLaunch) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
}